

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitterstate.cpp
# Opt level: O2

bool __thiscall
YAML::EmitterState::SetNullFormat(EmitterState *this,EMITTER_MANIP value,value scope)

{
  if (value - LowerNull < 4) {
    _Set<YAML::EMITTER_MANIP>(this,&this->m_nullFmt,value,scope);
  }
  return value - LowerNull < 4;
}

Assistant:

bool EmitterState::SetNullFormat(EMITTER_MANIP value, FmtScope::value scope) {
  switch (value) {
    case LowerNull:
    case UpperNull:
    case CamelNull:
    case TildeNull:
      _Set(m_nullFmt, value, scope);
      return true;
    default:
      return false;
  }
}